

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QMainWindowLayoutState::setCentralWidget(QMainWindowLayoutState *this,QWidget *widget)

{
  long in_RSI;
  QMainWindowLayoutState *in_RDI;
  QWidgetItemV2 *unaff_retaddr;
  QLayoutItem *item;
  QLayoutItem *local_18;
  QMainWindowLayoutState *widget_00;
  
  local_18 = (QLayoutItem *)0x0;
  widget_00 = in_RDI;
  deleteCentralWidgetItem(in_RDI);
  if (in_RSI != 0) {
    local_18 = (QLayoutItem *)operator_new(0x58);
    QWidgetItemV2::QWidgetItemV2(unaff_retaddr,(QWidget *)widget_00);
  }
  (in_RDI->dockAreaLayout).centralWidgetItem = local_18;
  return;
}

Assistant:

void QMainWindowLayoutState::setCentralWidget(QWidget *widget)
{
    QLayoutItem *item = nullptr;
    //make sure we remove the widget
    deleteCentralWidgetItem();

    if (widget != nullptr)
        item = new QWidgetItemV2(widget);

#if QT_CONFIG(dockwidget)
    dockAreaLayout.centralWidgetItem = item;
#else
    centralWidgetItem = item;
#endif
}